

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.cc
# Opt level: O1

void xLearn::sq_gradient_thread
               (DMatrix *matrix,Model *model,Score *score_func,bool is_norm,real_t *sum,
               index_t start,index_t end)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  pointer pfVar2;
  ostream *poVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  Logger local_84;
  undefined4 local_80;
  float local_7c;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_80 = (undefined4)CONCAT71(in_register_00000009,is_norm);
  if (start <= end) {
    *sum = 0.0;
    if (start < end) {
      local_78 = (ulong)end;
      uVar4 = (ulong)start;
      do {
        local_7c = 1.0;
        if ((char)local_80 != '\0') {
          local_7c = (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4];
        }
        pvVar1 = (matrix->row).
                 super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4];
        fVar5 = local_7c;
        (*score_func->_vptr_Score[3])(score_func,pvVar1,model);
        pfVar2 = (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        auVar6 = ZEXT416((uint)(pfVar2[uVar4] - fVar5));
        auVar6 = vfmadd213ss_fma(auVar6,auVar6,ZEXT416((uint)*sum));
        *sum = auVar6._0_4_;
        (*score_func->_vptr_Score[4])
                  ((ulong)(uint)(fVar5 - pfVar2[uVar4]),(ulong)(uint)local_7c,score_func,pvVar1,
                   model);
        uVar4 = uVar4 + 1;
      } while (local_78 != uVar4);
    }
    *sum = *sum * 0.5;
    return;
  }
  local_84.severity_ = ERR;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/squared_loss.cc"
             ,"");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"sq_gradient_thread","");
  poVar3 = Logger::Start(ERR,&local_50,0x56,&local_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK_GE failed ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/squared_loss.cc"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x56);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"start",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_84);
  abort();
}

Assistant:

void sq_gradient_thread(const DMatrix* matrix,
                        Model* model,
                        Score* score_func,
                        bool is_norm,
                        real_t* sum,
                        index_t start,
                        index_t end) {
  CHECK_GE(end, start);
  *sum = 0;
  for (size_t i = start; i < end; ++i) {
    SparseRow* row = matrix->row[i];
    real_t norm = is_norm ? matrix->norm[i] : 1.0;
    real_t pred = score_func->CalcScore(row, *model, norm);
    // loss
    real_t error = matrix->Y[i] - pred;
    *sum += (error*error);
    // partial gradient: -error
    real_t pg = pred - matrix->Y[i];
    // real gradient and update
    score_func->CalcGrad(row, *model, pg, norm);
  }
  *sum *= 0.5;
}